

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall helics::FederateInfo::loadInfoFromArgsIgnoreOutput(FederateInfo *this,string *args)

{
  ParseOutput PVar1;
  undefined8 uVar2;
  char *in_RDI;
  ParseOutput ret;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  App *in_stack_00000068;
  FederateInfo *in_stack_00000070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000088;
  helicsCLI11App *in_stack_00000090;
  FederateInfo *in_stack_00001f88;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  
  makeCLIApp(in_stack_00001f88);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3fa01c);
  PVar1 = helicsCLI11App::helics_parse<std::__cxx11::string_const&>
                    (in_stack_00000090,in_stack_00000088);
  if (PVar1 == PARSE_ERROR) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,in_RDI);
    InvalidParameter::InvalidParameter
              ((InvalidParameter *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar2,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
            (in_stack_ffffffffffffffb0);
  config_additional(in_stack_00000070,in_stack_00000068);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void FederateInfo::loadInfoFromArgsIgnoreOutput(const std::string& args)
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(args);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
}